

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O0

void calc_mean_and_sd_weighted<float,int,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean,
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *w)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  int *piVar6;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  bool bVar7;
  longdouble in_ST0;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar11;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x;
  double dVar12;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  long in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000018;
  size_t *row_1;
  longdouble w_this;
  longdouble m_prev;
  longdouble s;
  longdouble m;
  longdouble added;
  size_t row;
  longdouble cnt;
  size_t *ptr_st;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  unsigned_long *in_stack_fffffffffffffed8;
  undefined2 in_stack_fffffffffffffee0;
  undefined6 in_stack_fffffffffffffee2;
  undefined2 in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef2;
  unsigned_long *in_stack_fffffffffffffef8;
  undefined2 in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff02;
  byte local_ea;
  ulong *local_e0;
  longdouble local_c8;
  longdouble local_b8;
  longdouble local_a8;
  longdouble local_98;
  ulong local_80;
  longdouble local_78;
  long local_48;
  
  if (*(int *)(in_stack_00000008 + in_RCX * 4) == *(int *)(in_stack_00000008 + 4 + in_RCX * 4)) {
    *in_stack_00000010 = 0.0;
    *in_stack_00000018 = 0.0;
  }
  else {
    local_48 = (long)*(int *)(in_stack_00000008 + in_RCX * 4);
    lVar4 = (long)(*(int *)(in_stack_00000008 + 4 + in_RCX * 4) + -1);
    iVar1 = *(int *)(in_R9 + lVar4 * 4);
    local_e0 = std::lower_bound<unsigned_long*,unsigned_long>
                         ((unsigned_long *)
                          CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),
                          in_stack_fffffffffffffef8,
                          (unsigned_long *)
                          CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0));
    local_78 = (longdouble)0;
    dVar12 = extraout_XMM0_Qa;
    for (local_80 = in_RSI; local_80 <= in_RDX; local_80 = local_80 + 1) {
      pdVar5 = tsl::
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               ::operator[]((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                             *)CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffed8);
      local_78 = local_78 + (longdouble)*pdVar5;
      dVar12 = extraout_XMM0_Qa_00;
    }
    local_c8 = (longdouble)0;
    local_b8 = local_c8;
    local_a8 = local_c8;
    local_98 = local_c8;
    while( true ) {
      bVar7 = false;
      if ((local_e0 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (bVar7 = false, local_48 != lVar4 + 1)
         ) {
        bVar7 = *local_e0 <= (ulong)(long)iVar1;
      }
      if (!bVar7) break;
      if (*(int *)(in_R9 + local_48 * 4) == (int)*local_e0) {
        uVar2 = std::isnan((double)(ulong)*(uint *)(in_R8 + local_48 * 4));
        local_ea = 1;
        lVar8 = in_ST0;
        if ((uVar2 & 1) == 0) {
          iVar3 = std::isinf((double)(ulong)*(uint *)(in_R8 + local_48 * 4));
          local_ea = (byte)iVar3;
          lVar8 = in_ST0;
        }
        if ((local_ea & 1) == 0) {
          pdVar5 = tsl::
                   robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                   ::operator[]((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                 *)CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                                in_stack_fffffffffffffed8);
          lVar9 = (longdouble)*pdVar5;
          if ((local_98 == (longdouble)0) && (!NAN(local_98) && !NAN((longdouble)0))) {
            local_c8 = (longdouble)*(float *)(in_R8 + local_48 * 4);
          }
          local_98 = local_98 + lVar9;
          lVar11 = in_ST3;
          dVar12 = std::fma(__x,in_XMM1_Qa,in_XMM2_Qa);
          lVar10 = (longdouble)*(float *)(in_R8 + local_48 * 4);
          in_stack_fffffffffffffef8 = SUB108(local_b8,0);
          in_stack_ffffffffffffff00 = (undefined2)((unkuint10)local_b8 >> 0x40);
          in_stack_fffffffffffffef0 =
               (undefined2)((unkuint10)((lVar10 - lVar8) * (lVar10 - local_c8)) >> 0x40);
          in_stack_fffffffffffffed8 = SUB108(lVar9,0);
          in_stack_fffffffffffffee0 = (undefined2)((unkuint10)lVar9 >> 0x40);
          lVar10 = lVar11;
          dVar12 = std::fma(dVar12,in_XMM1_Qa,in_XMM2_Qa);
          in_ST0 = in_ST2;
          lVar9 = in_ST3;
          in_ST2 = lVar11;
          in_ST3 = lVar10;
          local_c8 = lVar8;
          local_b8 = in_ST1;
          local_a8 = lVar8;
        }
        else {
          pdVar5 = tsl::
                   robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                   ::operator[]((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                 *)CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                                in_stack_fffffffffffffed8);
          local_78 = local_78 - (longdouble)*pdVar5;
          in_ST0 = lVar8;
          lVar9 = in_ST1;
          dVar12 = extraout_XMM0_Qa_01;
        }
        if ((local_e0 == (ulong *)(in_RDI + in_RDX * 8)) || (local_48 == lVar4)) break;
        local_e0 = local_e0 + 1;
        piVar6 = std::lower_bound<int*,unsigned_long>
                           ((int *)CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),
                            (int *)in_stack_fffffffffffffef8,
                            (unsigned_long *)
                            CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0));
        local_48 = (long)piVar6 - in_R9 >> 2;
        in_ST1 = lVar9;
        dVar12 = extraout_XMM0_Qa_02;
      }
      else if ((int)*local_e0 < *(int *)(in_R9 + local_48 * 4)) {
        local_e0 = std::lower_bound<unsigned_long*,int>
                             ((unsigned_long *)
                              CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),
                              in_stack_fffffffffffffef8,
                              (int *)CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0));
        dVar12 = extraout_XMM0_Qa_03;
      }
      else {
        piVar6 = std::lower_bound<int*,unsigned_long>
                           ((int *)CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),
                            (int *)in_stack_fffffffffffffef8,
                            (unsigned_long *)
                            CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0));
        local_48 = (long)piVar6 - in_R9 >> 2;
        dVar12 = extraout_XMM0_Qa_04;
      }
    }
    if ((local_98 != (longdouble)0) || (NAN(local_98) || NAN((longdouble)0))) {
      if (local_98 < local_78) {
        local_a8 = local_a8 * (local_98 / local_78);
      }
      *in_stack_00000018 = (double)local_a8;
      std::sqrt(dVar12);
      *in_stack_00000010 = (double)in_ST0;
    }
    else {
      *in_stack_00000018 = 0.0;
      *in_stack_00000010 = 0.0;
    }
  }
  return;
}

Assistant:

void calc_mean_and_sd_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               double &restrict x_sd, double &restrict x_mean, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt -= w[*row];
            }

            else
            {
                w_this = w[*row];
                if (added == 0) m_prev = Xc[curr_pos];
                added += w_this;
                m = std::fma(w_this, (Xc[curr_pos] - m) / added, m);
                s = std::fma(w_this, (Xc[curr_pos] - m) * (Xc[curr_pos] - m_prev), s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * (added * ((ldouble_safe)1 - (ldouble_safe)added/(ldouble_safe)cnt));
        m *= added / cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (ldouble_safe)cnt);
}